

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_stream.cpp
# Opt level: O0

ContentReader * __thiscall dap::ContentReader::operator=(ContentReader *this,ContentReader *rhs)

{
  ContentReader *rhs_local;
  ContentReader *this_local;
  
  std::deque<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->buf,&rhs->buf);
  std::shared_ptr<dap::Reader>::operator=(&this->reader,&rhs->reader);
  this->on_invalid_data = rhs->on_invalid_data;
  return this;
}

Assistant:

ContentReader& ContentReader::operator=(ContentReader&& rhs) noexcept {
  buf = std::move(rhs.buf);
  reader = std::move(rhs.reader);
  on_invalid_data = std::move(rhs.on_invalid_data);
  return *this;
}